

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::unaryWithOutputByComponent<double,_double,_double>::call
          (unaryWithOutputByComponent<double,_double,_double> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  code *pcVar1;
  GLuint GVar2;
  GLuint x;
  GLuint y;
  uint uVar3;
  undefined8 uVar4;
  double *second_arg;
  double first_arg;
  GLuint component;
  functionPointer p_function;
  GLuint component_step_1;
  GLuint component_step_0;
  GLuint n_components;
  GLuint n_components_1;
  GLuint n_components_0;
  double *p_arg;
  double *p_out;
  double *p_result;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  unaryWithOutputByComponent<double,_double,_double> *this_local;
  
  GVar2 = GPUShaderFP64Test10::functionObject::getResultOffset((functionObject *)this,1);
  x = GPUShaderFP64Test10::functionObject::getArgumentComponents((functionObject *)this,0);
  y = GPUShaderFP64Test10::functionObject::getResultComponents((functionObject *)this,1);
  uVar3 = de::max<unsigned_int>(x,y);
  pcVar1 = (code *)(this->super_unaryBase).super_functionObject.m_p_function;
  for (first_arg._4_4_ = 0; first_arg._4_4_ < uVar3; first_arg._4_4_ = first_arg._4_4_ + 1) {
    uVar4 = (*pcVar1)(*(undefined8 *)((long)argument_src + (ulong)(first_arg._4_4_ * (x != 1)) * 8),
                      (long)result_dst + (ulong)(first_arg._4_4_ * (y != 1)) * 8 + (ulong)GVar2);
    *(undefined8 *)((long)result_dst + (ulong)first_arg._4_4_ * 8) = uVar4;
  }
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT* p_result = (ResT*)result_dst;
		OutT* p_out	= (OutT*)((glw::GLubyte*)result_dst + getResultOffset(1));
		ArgT* p_arg	= (ArgT*)argument_src;

		const glw::GLuint n_components_0 = getArgumentComponents(0);
		const glw::GLuint n_components_1 = getResultComponents(1);
		const glw::GLuint n_components   = de::max(n_components_0, n_components_1);

		const glw::GLuint component_step_0 = (1 == n_components_0) ? 0 : 1;
		const glw::GLuint component_step_1 = (1 == n_components_1) ? 0 : 1;

		functionPointer p_function = (functionPointer)m_p_function;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const ArgT first_arg  = p_arg[component * component_step_0];
			OutT&	  second_arg = p_out[component * component_step_1];

			p_result[component] = p_function(first_arg, second_arg);
		}
	}